

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws_server.hpp
# Opt level: O0

error_or<int> * __thiscall
pstore::http::details::
send_extended_length_message<unsigned_long,WsServer_NothingFromClient_Test::TestBody()::__0,int>
          (error_or<int> *__return_storage_ptr__,details *this,anon_class_8_1_65350a3f sender,int io
          ,frame_fixed_layout *f,span<const_unsigned_char,__1L> *span)

{
  undefined4 in_register_0000000c;
  anon_class_16_2_52d05704 f_00;
  anon_class_16_2_9095cc0e f_01;
  error_or<int> local_b0;
  frame_fixed_layout *local_98;
  error_or<int> *peStack_90;
  error_or<int> local_80;
  error_or<int> *local_68;
  frame_fixed_layout *pfStack_60;
  error_or<int> *peStack_50;
  anon_class_16_2_9095cc0e send_payload;
  anon_class_16_2_52d05704 send_length;
  span<const_unsigned_char,__1L> *span_local;
  frame_fixed_layout *f_local;
  undefined1 auStack_18 [4];
  int io_local;
  anon_class_8_1_65350a3f sender_local;
  
  peStack_90 = (error_or<int> *)auStack_18;
  local_98 = f;
  local_68 = peStack_90;
  pfStack_60 = f;
  peStack_50 = peStack_90;
  send_payload.sender = (anon_class_8_1_65350a3f *)f;
  send_payload.span = (span<const_unsigned_char,__1L> *)f;
  _auStack_18 = this;
  sender_local.output =
       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)__return_storage_ptr__;
  send<WsServer_NothingFromClient_Test::TestBody()::__0,int,unsigned_short,void>
            (&local_b0,(http *)this,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             ((ulong)sender.output & 0xffffffff),(uint)*(ushort *)CONCAT44(in_register_0000000c,io),
             (unsigned_short)f);
  f_00.sender = (anon_class_8_1_65350a3f *)f;
  f_00.span = (span<const_unsigned_char,__1L> *)peStack_90;
  pstore::operator>>=(&local_80,(pstore *)&local_b0,(error_or<int> *)&local_98->payload_length,f_00)
  ;
  f_01.span = (span<const_unsigned_char,__1L> *)f;
  f_01.sender = (anon_class_8_1_65350a3f *)pfStack_60;
  pstore::operator>>=(__return_storage_ptr__,(pstore *)&local_80,local_68,f_01);
  error_or<int>::~error_or(&local_80);
  error_or<int>::~error_or(&local_b0);
  return __return_storage_ptr__;
}

Assistant:

error_or<IO> send_extended_length_message (Sender sender, IO io,
                                                       frame_fixed_layout const & f,
                                                       gsl::span<std::uint8_t const> const & span) {
                auto send_length = [&] (IO io2) {
                    auto const size = span.size ();
                    PSTORE_ASSERT (
                        size >= 0 &&
                        static_cast<
                            std::make_unsigned<std::remove_const<decltype (size)>::type>::type> (
                            size) <= std::numeric_limits<LengthType>::max ());
                    return send (sender, io2, static_cast<LengthType> (size));
                };
                auto send_payload = [&] (IO io3) { return send (sender, io3, span); };

                return (send (sender, io, f.raw) >>= send_length) >>= send_payload;
            }